

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader.cc
# Opt level: O2

LP * fizplex::MPSReader::read_lp(LP *__return_storage_ptr__,string *mps_file)

{
  double value;
  Row row;
  char cVar1;
  bool bVar2;
  __type _Var3;
  istream *piVar4;
  iterator iVar5;
  long lVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  runtime_error *prVar9;
  string obj_name;
  string current_section;
  string line;
  Row local_4c0;
  string row_name;
  index_map vars;
  index_map rows;
  string local_418;
  string row_name_1;
  string first_word;
  istringstream iss;
  ifstream ifs;
  
  LP::LP(__return_storage_ptr__);
  std::ifstream::ifstream(&ifs,(string *)mps_file,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                   "Couldn\'t open file ",mps_file);
    std::runtime_error::runtime_error(prVar9,(string *)&iss);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  current_section._M_dataplus._M_p = (pointer)&current_section.field_2;
  current_section._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  current_section.field_2._M_local_buf[0] = '\0';
  rows._M_h._M_buckets = &rows._M_h._M_single_bucket;
  rows._M_h._M_bucket_count = 1;
  rows._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  rows._M_h._M_element_count = 0;
  rows._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  rows._M_h._M_rehash_policy._M_next_resize = 0;
  rows._M_h._M_single_bucket = (__node_base_ptr)0x0;
  vars._M_h._M_buckets = &vars._M_h._M_single_bucket;
  vars._M_h._M_bucket_count = 1;
  vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  vars._M_h._M_element_count = 0;
  vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  vars._M_h._M_rehash_policy._M_next_resize = 0;
  vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
  obj_name._M_dataplus._M_p = (pointer)&obj_name.field_2;
  obj_name._M_string_length = 0;
  obj_name.field_2._M_local_buf[0] = '\0';
  do {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ifs,(string *)&line);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::string::~string((string *)&obj_name);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&vars._M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&rows._M_h);
      std::__cxx11::string::~string((string *)&current_section);
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&ifs);
      return __return_storage_ptr__;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
    next_word(&first_word,&iss);
    bVar2 = is_indicator(&first_word);
    if ((bVar2) && (bVar2 = std::operator!=(&current_section,&first_word), bVar2)) {
      std::__cxx11::string::_M_assign((string *)&current_section);
    }
    else {
      bVar2 = std::operator==(&current_section,"ROWS");
      if (bVar2) {
        next_word(&row_name,&iss);
        bVar2 = std::operator==(&first_word,"N");
        if ((bVar2) && (obj_name._M_string_length == 0)) {
          std::__cxx11::string::_M_assign((string *)&obj_name);
        }
        else {
          parse_row_type(&local_4c0,&first_word);
          row.lower = local_4c0.lower;
          row.type = local_4c0.type;
          row._4_4_ = local_4c0._4_4_;
          row.upper = local_4c0.upper;
          LP::add_row(__return_storage_ptr__,row);
          if (row_name._M_string_length == 0) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"Row name is empty");
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          sVar7 = LP::row_count(__return_storage_ptr__);
          pmVar8 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&rows,&row_name);
          *pmVar8 = sVar7 - 1;
        }
LAB_0017a8af:
        std::__cxx11::string::~string((string *)&row_name);
      }
      else {
        bVar2 = std::operator==(&current_section,"RHS");
        if (bVar2) {
          parse_and_add_rhs(&first_word,&iss,&rows,__return_storage_ptr__);
        }
        else {
          bVar2 = std::operator==(&current_section,"COLUMNS");
          if (bVar2) {
            std::__cxx11::string::string((string *)&row_name,(string *)&first_word);
            iVar5 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&vars._M_h,&row_name);
            if (iVar5.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              LP::add_column(__return_storage_ptr__,LowerBound,0.0,INFINITY,0.0);
              sVar7 = LP::column_count(__return_storage_ptr__);
              pmVar8 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&vars,&row_name);
              *pmVar8 = sVar7 - 1;
            }
            while (lVar6 = std::streambuf::in_avail(), 0 < lVar6) {
              next_word(&row_name_1,&iss);
              next_word(&local_418,&iss);
              value = std::__cxx11::stod(&local_418,(size_t *)0x0);
              std::__cxx11::string::~string((string *)&local_418);
              _Var3 = std::operator==(&row_name_1,&obj_name);
              if (_Var3) {
                pmVar8 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&vars,&row_name);
                LP::add_obj_value(__return_storage_ptr__,*pmVar8,value);
              }
              else {
                pmVar8 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&rows,&row_name_1);
                sVar7 = *pmVar8;
                pmVar8 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&vars,&row_name);
                LP::add_value(__return_storage_ptr__,sVar7,*pmVar8,value);
              }
              std::__cxx11::string::~string((string *)&row_name_1);
            }
            goto LAB_0017a8af;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&first_word);
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  } while( true );
}

Assistant:

LP read_lp(std::string mps_file) {
  LP lp;
  std::ifstream ifs(mps_file);
  if (!ifs.is_open())
    throw std::runtime_error("Couldn't open file " + mps_file);
  std::string line, current_section;
  index_map rows, vars;
  std::string obj_name;
  while (std::getline(ifs, line)) {
    std::istringstream iss(line);
    const auto first_word = next_word(iss);
    if (is_indicator(first_word) && current_section != first_word)
      current_section = first_word;
    else { // Data record
      if (current_section == "ROWS") {
        const std::string row_name = next_word(iss);
        if (first_word == "N" && obj_name.empty())
          obj_name = row_name;
        else {
          lp.add_row(parse_row_type(first_word));
          if (!row_name.empty())
            rows[row_name] = lp.row_count() - 1;
          else
            throw std::runtime_error("Row name is empty");
        }
      } else if (current_section == "RHS")
        parse_and_add_rhs(first_word, iss, rows, lp);
      else if (current_section == "COLUMNS") {
        const std::string var_name = first_word;
        if (vars.find(var_name) == vars.end()) {
          lp.add_column(ColType::LowerBound, 0, inf);
          vars[var_name] = lp.column_count() - 1;
        }
        while (iss.rdbuf()->in_avail() > 0) {
          const std::string row_name = next_word(iss);
          const auto val = std::stod(next_word(iss));
          if (row_name == obj_name)
            lp.add_obj_value(vars[var_name], val);
          else
            lp.add_value(rows[row_name], vars[var_name], val);
        }
      }
    }
  }
  return lp;
}